

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balance.hpp
# Opt level: O1

void Block::save(void *b_,BinaryBuffer *bb)

{
  (*bb->_vptr_BinaryBuffer[2])(bb,b_,4);
  diy::Serialization<diy::DynamicPoint<int,_4UL>_>::save(bb,(Point *)((long)b_ + 8));
  diy::Serialization<diy::DynamicPoint<int,_4UL>_>::save(bb,(Point *)((long)b_ + 0x48));
  diy::Serialization<std::vector<double,_std::allocator<double>_>_>::save
            (bb,(Vector *)((long)b_ + 0x88));
  (*bb->_vptr_BinaryBuffer[2])(bb,(long)b_ + 0xa0,4);
  return;
}

Assistant:

static void save(const void* b_, diy::BinaryBuffer& bb)
    {
        const Block* b = static_cast<const Block*>(b_);

        diy::save(bb, b->gid);
        diy::save(bb, b->bounds);
        diy::save(bb, b->x);
        diy::save(bb, b->work);
    }